

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deploymentinfo.cpp
# Opt level: O0

optional<Consensus::BuriedDeployment> GetBuriedDeployment(string_view name)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  BuriedDeployment *in_stack_ffffffffffffff20;
  optional<Consensus::BuriedDeployment> *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff46;
  char *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *pcVar2;
  _Optional_payload_base<Consensus::BuriedDeployment> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  __x._M_str = in_stack_ffffffffffffff58;
  __x._M_len = in_stack_ffffffffffffff50;
  __y._M_len._6_2_ = in_stack_ffffffffffffff46;
  __y._M_len._0_6_ = in_stack_ffffffffffffff40;
  __y._M_str = in_stack_ffffffffffffff48;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::optional<Consensus::BuriedDeployment>::optional<Consensus::BuriedDeployment,_true>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    __x_00._M_str = in_stack_ffffffffffffff58;
    __x_00._M_len = in_stack_ffffffffffffff50;
    __y_00._M_len._6_2_ = in_stack_ffffffffffffff46;
    __y_00._M_len._0_6_ = in_stack_ffffffffffffff40;
    __y_00._M_str = in_stack_ffffffffffffff48;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      std::optional<Consensus::BuriedDeployment>::optional<Consensus::BuriedDeployment,_true>
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      __x_01._M_str = in_stack_ffffffffffffff58;
      __x_01._M_len = in_stack_ffffffffffffff50;
      __y_01._M_len._6_2_ = in_stack_ffffffffffffff46;
      __y_01._M_len._0_6_ = in_stack_ffffffffffffff40;
      __y_01._M_str = in_stack_ffffffffffffff48;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        std::optional<Consensus::BuriedDeployment>::optional<Consensus::BuriedDeployment,_true>
                  (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      }
      else {
        pcVar2 = in_RDI;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        __x_02._M_str = pcVar2;
        __x_02._M_len = in_stack_ffffffffffffff50;
        __y_02._M_len._6_2_ = in_stack_ffffffffffffff46;
        __y_02._M_len._0_6_ = in_stack_ffffffffffffff40;
        __y_02._M_str = in_stack_ffffffffffffff48;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          std::optional<Consensus::BuriedDeployment>::optional<Consensus::BuriedDeployment,_true>
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RSI,in_RDI);
          __x_03._M_str = pcVar2;
          __x_03._M_len = in_stack_ffffffffffffff50;
          __y_03._M_len._6_2_ = in_stack_ffffffffffffff46;
          __y_03._M_len._0_6_ = in_stack_ffffffffffffff40;
          __y_03._M_str = in_stack_ffffffffffffff48;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            std::optional<Consensus::BuriedDeployment>::optional<Consensus::BuriedDeployment,_true>
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
          }
          else {
            std::optional<Consensus::BuriedDeployment>::optional
                      ((optional<Consensus::BuriedDeployment> *)&local_c);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (_Optional_base<Consensus::BuriedDeployment,_true,_true>)
           (_Optional_base<Consensus::BuriedDeployment,_true,_true>)local_c;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Consensus::BuriedDeployment> GetBuriedDeployment(const std::string_view name)
{
    if (name == "segwit") {
        return Consensus::BuriedDeployment::DEPLOYMENT_SEGWIT;
    } else if (name == "bip34") {
        return Consensus::BuriedDeployment::DEPLOYMENT_HEIGHTINCB;
    } else if (name == "dersig") {
        return Consensus::BuriedDeployment::DEPLOYMENT_DERSIG;
    } else if (name == "cltv") {
        return Consensus::BuriedDeployment::DEPLOYMENT_CLTV;
    } else if (name == "csv") {
        return Consensus::BuriedDeployment::DEPLOYMENT_CSV;
    }
    return std::nullopt;
}